

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O3

void __thiscall cppcms::impl::file_server::list_dir(file_server *this,string *url,string *path)

{
  pointer pcVar1;
  int iVar2;
  response *this_00;
  ostream *poVar3;
  ostream *poVar4;
  string *psVar5;
  long *plVar6;
  size_t sVar7;
  ulong uVar8;
  size_type *psVar9;
  long lVar10;
  short sVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  port_stat st;
  allocator local_272;
  allocator local_271;
  string local_270;
  string local_250;
  string *local_230;
  string local_228;
  string local_208;
  undefined1 local_1e8 [144];
  DIR *local_158;
  dirent local_150;
  dirent *local_38;
  
  local_38 = (dirent *)0x0;
  local_230 = path;
  local_158 = opendir((path->_M_dataplus)._M_p);
  if (local_158 == (DIR *)0x0) {
    show404(this);
LAB_001eaeaf:
    local_38 = (dirent *)0x0;
    if (local_158 != (DIR *)0x0) {
      closedir(local_158);
    }
    return;
  }
  this_00 = application::response(&this->super_application);
  poVar3 = http::response::out(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n     \"http://www.w3.org/TR/html4/loose.dtd\">\n"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"<html><head><title>Directory Listing</title></head>\n<body><h1>Index of ",0x47)
  ;
  util::escape((string *)local_1e8,url);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_1e8._0_8_,local_1e8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</h1>\n",6);
  pcVar12 = local_1e8 + 0x10;
  if ((char *)local_1e8._0_8_ != pcVar12) {
    operator_delete((void *)local_1e8._0_8_);
  }
  psVar5 = (string *)
           booster::locale::ios_info::get((ios_base *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)))
  ;
  local_1e8._16_4_ = 0x544d47;
  local_1e8._8_8_ = 3;
  local_1e8._0_8_ = pcVar12;
  booster::locale::ios_info::time_zone(psVar5);
  if ((char *)local_1e8._0_8_ != pcVar12) {
    operator_delete((void *)local_1e8._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<table>\n",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "<thead><tr><td width=\'60%\'>File</td><td width=\'20%\' >Date</td><td width=\'5%\'>&nbsp;</td><td width=\'15%\'>Size</td></tr></thead>\n<tbody>\n"
             ,0x87);
  iVar2 = std::__cxx11::string::compare((char *)url);
  if ((iVar2 != 0) && (url->_M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "<tr><td><code><a href=\'../\' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n"
               ,0x62);
  }
  booster::locale::as::ftime<char>((add_ftime<char> *)local_1e8,"%Y-%m-%d %H:%M:%S");
  booster::locale::as::details::add_ftime<char>::apply
            ((add_ftime<char> *)local_1e8,
             (basic_ios<char,_std::char_traits<char>_> *)
             (poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
  if ((char *)local_1e8._0_8_ != pcVar12) {
    operator_delete((void *)local_1e8._0_8_);
  }
  do {
    do {
      iVar2 = readdir_r(local_158,&local_150,&local_38);
      if ((iVar2 != 0) || (local_38 == (dirent *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</tbody>\n</table>\n",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"<p>CppCMS-Embedded/2.0.0.beta2</p>\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</body>\n",8);
        goto LAB_001eaeaf;
      }
    } while (local_38->d_name[0] == '.');
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    pcVar1 = (local_230->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,pcVar1,pcVar1 + local_230->_M_string_length);
    std::__cxx11::string::append((char *)&local_270);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_250.field_2._M_allocated_capacity = *psVar9;
      local_250.field_2._8_8_ = plVar6[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar9;
      local_250._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_250._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar2 = stat(local_250._M_dataplus._M_p,(stat *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if (-1 < iVar2) {
      pcVar12 = "(/";
      sVar11 = (short)local_1e8._24_4_;
      if ((((uint)local_1e8._24_4_ >> 0xe & 1) != 0) || (pcVar12 = "\x01", sVar11 < 0)) {
        pcVar12 = pcVar12 + 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<tr>",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<td><code><a href=\'",0x13);
        std::__cxx11::string::string((string *)&local_270,local_38->d_name,&local_271);
        util::urlencode(&local_250,&local_270);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_250._M_dataplus._M_p,local_250._M_string_length);
        sVar7 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar12,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'>",2);
        std::__cxx11::string::string((string *)&local_208,local_38->d_name,&local_272);
        util::escape(&local_228,&local_208);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar12,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</a></code></td>",0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<td>",4);
        uVar8 = booster::locale::ios_info::get
                          ((ios_base *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
        booster::locale::ios_info::display_flags(uVar8);
        poVar4 = std::ostream::_M_insert<long>((long)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</td><td>&nbsp;</td>",0x14);
        lVar10 = 0x1d;
        pcVar12 = "<td> <strong>-</strong> </td>";
        poVar4 = poVar3;
        if (sVar11 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<td>",4);
          uVar8 = booster::locale::ios_info::get
                            ((ios_base *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
          booster::locale::ios_info::display_flags(uVar8);
          poVar4 = std::ostream::_M_insert<long>((long)poVar3);
          lVar10 = 5;
          pcVar12 = "</td>";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar12,lVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</tr>\n",6);
      }
    }
  } while( true );
}

Assistant:

void file_server::list_dir(std::string const &url,std::string const &path)
{
	cppcms::impl::directory d;
	if(!d.open(path)) {
		show404();
		return;
	}
	
#ifdef CPPCMS_WIN_NATIVE
	response().content_type("text/html; charset=UTF-8");
#endif
	std::ostream &out = response().out();
	out << "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
	       "     \"http://www.w3.org/TR/html4/loose.dtd\">\n";

	out << "<html><head><title>Directory Listing</title></head>\n"
		"<body><h1>Index of " << util::escape(url) << "</h1>\n";
	out << booster::locale::as::gmt;
	//out <<"<table cellpadding='0' cellspacing='2' border='0' >\n";
	out <<"<table>\n";
	out <<"<thead><tr><td width='60%'>File</td><td width='20%' >Date</td><td width='5%'>&nbsp;</td><td width='15%'>Size</td></tr></thead>\n"
		"<tbody>\n";
	if(url!="/" && !url.empty()) {
		out << "<tr><td><code><a href='../' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n";
	}
	out << booster::locale::as::ftime("%Y-%m-%d %H:%M:%S");
	while(d.next()) {
		if(memcmp(d.name(),".",1) == 0)
			continue;
		port_stat st;
		if(get_stat((path + "/" + d.name()).c_str(),&st) < 0)
			continue;
		char const *add="";
		if(st.st_mode & S_IFDIR)
			add="/";
		else if(st.st_mode & S_IFREG)
			;
		else 
			continue;
		out << "<tr>";
		out << "<td><code><a href='" 
			<< util::urlencode(d.name()) << add << "'>" << util::escape(d.name()) << add << "</a></code></td>";
		out << "<td>" << booster::locale::as::strftime << st.st_mtime <<"</td><td>&nbsp;</td>";
		if(st.st_mode & S_IFREG)
			out << "<td>" << booster::locale::as::number << st.st_size <<"</td>";
		else
			out << "<td> <strong>-</strong> </td>";
		out <<"</tr>\n";
	}
	out <<"</tbody>\n</table>\n";
	out <<"<p>CppCMS-Embedded/" CPPCMS_PACKAGE_VERSION "</p>\n";
	out <<"</body>\n";
}